

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EmptyBlockElimination.cc
# Opt level: O1

bool flow::transform::emptyBlockElimination(IRHandler *handler)

{
  _List_node_base *p_Var1;
  BasicBlock *this;
  Value *replacement;
  BasicBlock *pBVar2;
  pointer ppBVar3;
  undefined8 *******pppppppuVar4;
  TerminateInstr *pTVar5;
  long lVar6;
  _List_node_base *p_Var7;
  Instr *this_00;
  int iVar8;
  undefined8 *******pppppppuVar9;
  pointer ppBVar10;
  list<flow::BasicBlock_*,_std::allocator<flow::BasicBlock_*>_> eliminated;
  undefined8 *******local_50;
  undefined8 *******local_48;
  long local_40;
  IRHandler *local_38;
  
  local_48 = &local_50;
  local_50 = &local_50;
  local_40 = 0;
  local_38 = handler;
  for (p_Var1 = (handler->blocks_).
                super__List_base<std::unique_ptr<flow::BasicBlock,_std::default_delete<flow::BasicBlock>_>,_std::allocator<std::unique_ptr<flow::BasicBlock,_std::default_delete<flow::BasicBlock>_>_>_>
                ._M_impl._M_node.super__List_node_base._M_next;
      p_Var1 != (_List_node_base *)&handler->blocks_; p_Var1 = p_Var1->_M_next) {
    this = (BasicBlock *)p_Var1[1]._M_next;
    iVar8 = 3;
    if ((long)(this->code_).
              super__Vector_base<std::unique_ptr<flow::Instr,_std::default_delete<flow::Instr>_>,_std::allocator<std::unique_ptr<flow::Instr,_std::default_delete<flow::Instr>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish -
        (long)(this->code_).
              super__Vector_base<std::unique_ptr<flow::Instr,_std::default_delete<flow::Instr>_>,_std::allocator<std::unique_ptr<flow::Instr,_std::default_delete<flow::Instr>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start == 8) {
      pTVar5 = BasicBlock::getTerminator(this);
      if (pTVar5 == (TerminateInstr *)0x0) {
        lVar6 = 0;
      }
      else {
        lVar6 = __dynamic_cast(pTVar5,&TerminateInstr::typeinfo,&BrInstr::typeinfo,0);
      }
      if (lVar6 != 0) {
        replacement = (Value *)**(undefined8 **)(lVar6 + 0x50);
        p_Var7 = (_List_node_base *)operator_new(0x18);
        p_Var7[1]._M_next = (_List_node_base *)this;
        std::__detail::_List_node_base::_M_hook(p_Var7);
        local_40 = local_40 + 1;
        pBVar2 = (BasicBlock *)
                 (handler->blocks_).
                 super__List_base<std::unique_ptr<flow::BasicBlock,_std::default_delete<flow::BasicBlock>_>,_std::allocator<std::unique_ptr<flow::BasicBlock,_std::default_delete<flow::BasicBlock>_>_>_>
                 ._M_impl._M_node.super__List_node_base._M_next[1]._M_next;
        if (this == pBVar2) {
          iVar8 = 2;
          IRHandler::setEntryBlock(local_38,this);
        }
        else {
          ppBVar3 = (this->predecessors_).
                    super__Vector_base<flow::BasicBlock_*,_std::allocator<flow::BasicBlock_*>_>.
                    _M_impl.super__Vector_impl_data._M_finish;
          iVar8 = 0;
          for (ppBVar10 = (this->predecessors_).
                          super__Vector_base<flow::BasicBlock_*,_std::allocator<flow::BasicBlock_*>_>
                          ._M_impl.super__Vector_impl_data._M_start; ppBVar10 != ppBVar3;
              ppBVar10 = ppBVar10 + 1) {
            this_00 = &BasicBlock::getTerminator(*ppBVar10)->super_Instr;
            Instr::replaceOperand(this_00,(Value *)this,replacement);
          }
        }
        if (this == pBVar2) goto LAB_0014e49f;
      }
      iVar8 = 0;
    }
LAB_0014e49f:
    if ((iVar8 != 3) && (iVar8 != 0)) break;
  }
  pppppppuVar9 = &local_50;
  while (lVar6 = local_40, pppppppuVar9 = (undefined8 *******)*pppppppuVar9,
        (undefined8 ********)pppppppuVar9 != &local_50) {
    IRHandler::erase(((BasicBlock *)pppppppuVar9[2])->handler_,(BasicBlock *)pppppppuVar9[2]);
  }
  pppppppuVar9 = local_50;
  while ((undefined8 ********)pppppppuVar9 != &local_50) {
    pppppppuVar4 = (undefined8 *******)*pppppppuVar9;
    operator_delete(pppppppuVar9,0x18);
    pppppppuVar9 = pppppppuVar4;
  }
  return lVar6 != 0;
}

Assistant:

bool emptyBlockElimination(IRHandler* handler) {
  std::list<BasicBlock*> eliminated;

  for (BasicBlock* bb : handler->basicBlocks()) {
    if (bb->size() != 1)
      continue;

    if (BrInstr* br = dynamic_cast<BrInstr*>(bb->getTerminator())) {
      BasicBlock* newSuccessor = br->targetBlock();
      eliminated.push_back(bb);
      if (bb == handler->getEntryBlock()) {
        handler->setEntryBlock(bb);
        break;
      } else {
        for (BasicBlock* pred : bb->predecessors()) {
          pred->getTerminator()->replaceOperand(bb, newSuccessor);
        }
      }
    }
  }

  for (BasicBlock* bb : eliminated) {
    bb->getHandler()->erase(bb);
  }

  return eliminated.size() > 0;
}